

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O2

void __thiscall
google::protobuf::internal::EpsCopyInputStream::BackUp(EpsCopyInputStream *this,char *ptr)

{
  LogMessage *other;
  int count;
  LogMessage local_60;
  LogFinisher local_21;
  
  if (this->buffer_end_ + 0x10 < ptr) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/parse_context.h"
               ,0x74);
    other = LogMessage::operator<<(&local_60,"CHECK failed: ptr <= buffer_end_ + kSlopBytes: ");
    LogFinisher::operator=(&local_21,other);
    LogMessage::~LogMessage(&local_60);
  }
  if (this->next_chunk_ == this->buffer_) {
    count = (*(int *)&this->buffer_end_ - (int)ptr) + 0x10;
  }
  else {
    count = (*(int *)&this->buffer_end_ - (int)ptr) + this->size_;
  }
  if (0 < count) {
    StreamBackUp(this,count);
  }
  return;
}

Assistant:

void BackUp(const char* ptr) {
    GOOGLE_DCHECK(ptr <= buffer_end_ + kSlopBytes);
    int count;
    if (next_chunk_ == buffer_) {
      count = static_cast<int>(buffer_end_ + kSlopBytes - ptr);
    } else {
      count = size_ + static_cast<int>(buffer_end_ - ptr);
    }
    if (count > 0) StreamBackUp(count);
  }